

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

MockSpec<bool_(long_*)> * __thiscall
testing::internal::FunctionMocker<bool_(long_*)>::With
          (MockSpec<bool_(long_*)> *__return_storage_ptr__,FunctionMocker<bool_(long_*)> *this,
          Matcher<long_*> *m)

{
  tuple<testing::Matcher<long_*>_> local_38;
  Matcher<long_*> *local_20;
  Matcher<long_*> *m_local;
  FunctionMocker<bool_(long_*)> *this_local;
  
  local_20 = m;
  m_local = (Matcher<long_*> *)this;
  this_local = (FunctionMocker<bool_(long_*)> *)__return_storage_ptr__;
  std::make_tuple<testing::Matcher<long*>>(&local_38,m);
  MockSpec<bool_(long_*)>::MockSpec(__return_storage_ptr__,this,&local_38);
  std::tuple<testing::Matcher<long_*>_>::~tuple(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }